

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

bool __thiscall Json::Value::operator==(Value *this,Value *other)

{
  ushort uVar1;
  ObjectValues *pOVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint *__s;
  uint *__s_00;
  String local_40;
  size_t sVar8;
  
  uVar1 = *(ushort *)&other->bits_;
  cVar3 = (char)*(ushort *)&this->bits_;
  if ((char)uVar1 != cVar3) goto LAB_00131ef0;
  switch(cVar3) {
  case '\0':
    bVar4 = true;
    break;
  case '\x01':
  case '\x02':
    bVar4 = (this->value_).int_ == (other->value_).int_;
    break;
  case '\x03':
    bVar4 = (bool)(-((other->value_).real_ == (this->value_).real_) & 1);
    break;
  case '\x04':
    __s = (uint *)(this->value_).string_;
    __s_00 = (uint *)(other->value_).string_;
    if (__s_00 == (uint *)0x0 || __s == (uint *)0x0) {
      return __s == __s_00;
    }
    if ((*(ushort *)&this->bits_ >> 8 & 1) == 0) {
      sVar8 = strlen((char *)__s);
      uVar5 = (uint)sVar8;
    }
    else {
      uVar5 = *__s;
      __s = __s + 1;
    }
    if ((uVar1 >> 8 & 1) == 0) {
      sVar8 = strlen((char *)__s_00);
      uVar6 = (uint)sVar8;
    }
    else {
      uVar6 = *__s_00;
      __s_00 = __s_00 + 1;
    }
    if (uVar5 == uVar6) {
      if ((__s != (uint *)0x0) && (__s_00 != (uint *)0x0)) {
        iVar7 = memcmp(__s,__s_00,(ulong)uVar5);
        return iVar7 == 0;
      }
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"assert json failed","");
      throwLogicError(&local_40);
    }
    goto LAB_00131ef0;
  case '\x05':
    bVar4 = (this->value_).bool_ == (other->value_).bool_;
    break;
  case '\x06':
  case '\a':
    pOVar2 = (this->value_).map_;
    if ((pOVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
        (((other->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
      bVar4 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::pair<Json::Value::CZString_const,Json::Value>>,std::_Rb_tree_const_iterator<std::pair<Json::Value::CZString_const,Json::Value>>>
                        ((pOVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>
                          )&(pOVar2->_M_t)._M_impl.super__Rb_tree_header,
                         (((other->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                         _M_left);
      return bVar4;
    }
LAB_00131ef0:
    bVar4 = false;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/external/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x247,"bool Json::Value::operator==(const Value &) const");
  }
  return bVar4;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}